

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cpp
# Opt level: O0

bool __thiscall
iDynTree::ArticulatedBodyAlgorithmInternalBuffers::isConsistent
          (ArticulatedBodyAlgorithmInternalBuffers *this,Model *model)

{
  undefined1 uVar1;
  LinkWrenches *in_RSI;
  JointDOFsDoubleArray *in_RDI;
  bool ok;
  undefined1 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffd9;
  undefined1 in_stack_ffffffffffffffda;
  bool bVar2;
  undefined1 in_stack_ffffffffffffffdb;
  bool bVar3;
  undefined1 in_stack_ffffffffffffffdc;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 uVar7;
  undefined6 in_stack_ffffffffffffffe8;
  
  uVar1 = DOFSpatialMotionArray::isConsistent
                    ((DOFSpatialMotionArray *)in_RDI,
                     (Model *)CONCAT17(in_stack_ffffffffffffffdf,
                                       CONCAT16(in_stack_ffffffffffffffde,
                                                CONCAT15(in_stack_ffffffffffffffdd,
                                                         CONCAT14(in_stack_ffffffffffffffdc,
                                                                  CONCAT13(in_stack_ffffffffffffffdb
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffffda,
                                                  CONCAT11(in_stack_ffffffffffffffd9,
                                                           in_stack_ffffffffffffffd8))))))));
  uVar7 = false;
  if ((bool)uVar1) {
    uVar7 = DOFSpatialForceArray::isConsistent
                      ((DOFSpatialForceArray *)in_RDI,
                       (Model *)(ulong)CONCAT16(in_stack_ffffffffffffffde,
                                                CONCAT15(in_stack_ffffffffffffffdd,
                                                         CONCAT14(in_stack_ffffffffffffffdc,
                                                                  CONCAT13(in_stack_ffffffffffffffdb
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffffda,
                                                  CONCAT11(in_stack_ffffffffffffffd9,
                                                           in_stack_ffffffffffffffd8)))))));
  }
  uVar6 = false;
  if ((bool)uVar7 != false) {
    uVar6 = JointDOFsDoubleArray::isConsistent
                      (in_RDI,(Model *)CONCAT17(uVar7,(uint7)CONCAT15(in_stack_ffffffffffffffdd,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffffdc,
                                                  CONCAT13(in_stack_ffffffffffffffdb,
                                                           CONCAT12(in_stack_ffffffffffffffda,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffd9,
                                                  in_stack_ffffffffffffffd8)))))));
  }
  uVar5 = false;
  if ((bool)uVar6 != false) {
    uVar5 = JointDOFsDoubleArray::isConsistent
                      (in_RDI,(Model *)CONCAT17(uVar7,CONCAT16(uVar6,(uint6)CONCAT14(
                                                  in_stack_ffffffffffffffdc,
                                                  CONCAT13(in_stack_ffffffffffffffdb,
                                                           CONCAT12(in_stack_ffffffffffffffda,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffd9,
                                                  in_stack_ffffffffffffffd8)))))));
  }
  uVar4 = false;
  if ((bool)uVar5 != false) {
    uVar4 = LinkVelArray::isConsistent
                      ((LinkVelArray *)in_RDI,
                       (Model *)CONCAT17(uVar7,CONCAT16(uVar6,CONCAT15(uVar5,(uint5)CONCAT13(
                                                  in_stack_ffffffffffffffdb,
                                                  CONCAT12(in_stack_ffffffffffffffda,
                                                           CONCAT11(in_stack_ffffffffffffffd9,
                                                                    in_stack_ffffffffffffffd8)))))))
    ;
  }
  bVar3 = false;
  if ((bool)uVar4 != false) {
    bVar3 = LinkAccArray::isConsistent
                      ((LinkAccArray *)in_RDI,
                       (Model *)CONCAT17(uVar7,CONCAT16(uVar6,CONCAT15(uVar5,CONCAT14(uVar4,(uint)
                                                  CONCAT12(in_stack_ffffffffffffffda,
                                                           CONCAT11(in_stack_ffffffffffffffd9,
                                                                    in_stack_ffffffffffffffd8)))))))
    ;
  }
  bVar2 = false;
  if (bVar3 != false) {
    bVar2 = LinkArticulatedBodyInertias::isConsistent
                      ((LinkArticulatedBodyInertias *)in_RDI,
                       (Model *)CONCAT17(uVar7,CONCAT16(uVar6,CONCAT15(uVar5,CONCAT14(uVar4,CONCAT13
                                                  (bVar3,(uint3)CONCAT11(in_stack_ffffffffffffffd9,
                                                                         in_stack_ffffffffffffffd8))
                                                  )))));
  }
  bVar3 = false;
  if (bVar2 != false) {
    bVar3 = LinkWrenches::isConsistent
                      (in_RSI,(Model *)CONCAT17(bVar2,CONCAT16(uVar1,in_stack_ffffffffffffffe8)));
  }
  return bVar3;
}

Assistant:

bool ArticulatedBodyAlgorithmInternalBuffers::isConsistent(const Model& model)
{
    bool ok = true;

    ok = ok && S.isConsistent(model);
    ok = ok && U.isConsistent(model);
    ok = ok && D.isConsistent(model);
    ok = ok && u.isConsistent(model);
    ok = ok && linksVel.isConsistent(model);
    ok = ok && linksBiasAcceleration.isConsistent(model);
    ok = ok && linkABIs.isConsistent(model);
    ok = ok && linksBiasWrench.isConsistent(model);

    return ok;
}